

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::TextureLayerAttachmentTest::SubTestAttachmentError
          (TextureLayerAttachmentTest *this,GLenum attachment,GLenum texture_target,GLuint level,
          GLint layer,GLuint levels,GLint layers)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  bool bVar4;
  Enum<int,_2UL> EVar5;
  Enum<int,_2UL> local_220;
  GetNameFunc local_210;
  int local_208;
  Enum<int,_2UL> local_200;
  GetNameFunc local_1f0;
  int local_1e8;
  Enum<int,_2UL> local_1e0 [2];
  MessageBuilder local_1c0;
  int local_3c;
  long lStack_38;
  GLenum error;
  Functions *gl;
  GLint local_28;
  GLuint levels_local;
  GLint layer_local;
  GLuint level_local;
  GLenum texture_target_local;
  GLenum attachment_local;
  TextureLayerAttachmentTest *this_local;
  
  gl._4_4_ = levels;
  local_28 = layer;
  levels_local = level;
  layer_local = texture_target;
  level_local = attachment;
  _texture_target_local = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_38 = CONCAT44(extraout_var,iVar1);
  local_3c = (**(code **)(lStack_38 + 0x800))();
  bVar4 = local_3c == 0;
  if (!bVar4) {
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1c0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1c0,(char (*) [29])"NamedFramebufferTexture for ");
    EVar5 = glu::getFramebufferAttachmentStr(level_local);
    local_1f0 = EVar5.m_getName;
    local_1e8 = EVar5.m_value;
    local_1e0[0].m_getName = local_1f0;
    local_1e0[0].m_value = local_1e8;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1e0);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [16])" attachment of ");
    EVar5 = glu::getTextureTargetStr(layer_local);
    local_210 = EVar5.m_getName;
    local_208 = EVar5.m_value;
    local_200.m_getName = local_210;
    local_200.m_value = local_208;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_200);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [19])" texture at level ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&levels_local);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [15])" and at layer ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_28);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [20])" where texture has ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(uint *)((long)&gl + 4));
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [13])" levels and ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&layers);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [33])" layers failed with error value ");
    EVar5 = glu::getErrorStr(local_3c);
    local_220.m_getName = EVar5.m_getName;
    local_220.m_value = EVar5.m_value;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_220);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2b6cb9a);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c0);
  }
  return bVar4;
}

Assistant:

bool TextureLayerAttachmentTest::SubTestAttachmentError(glw::GLenum attachment, glw::GLenum texture_target,
														glw::GLuint level, glw::GLint layer, glw::GLuint levels,
														glw::GLint layers)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check and log. */
	if (glw::GLenum error = gl.getError())
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "NamedFramebufferTexture for " << glu::getFramebufferAttachmentStr(attachment)
			<< " attachment of " << glu::getTextureTargetStr(texture_target) << " texture at level " << level
			<< " and at layer " << layer << " where texture has " << levels << " levels and " << layers
			<< " layers failed with error value " << glu::getErrorStr(error) << "." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}